

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

void __thiscall
icu_63::Transliterator::Transliterator
          (Transliterator *this,UnicodeString *theID,UnicodeFilter *adoptedFilter)

{
  int32_t iVar1;
  __off_t __length;
  UnicodeFilter *adoptedFilter_local;
  UnicodeString *theID_local;
  Transliterator *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Transliterator_005b9120;
  icu_63::UnicodeString::UnicodeString(&this->ID,theID);
  this->filter = adoptedFilter;
  this->maximumContextLength = 0;
  icu_63::UnicodeString::append(&this->ID,L'\0');
  iVar1 = icu_63::UnicodeString::length(&this->ID);
  icu_63::UnicodeString::truncate(&this->ID,(char *)(ulong)(iVar1 - 1),__length);
  return;
}

Assistant:

Transliterator::Transliterator(const UnicodeString& theID,
                               UnicodeFilter* adoptedFilter) :
    UObject(), ID(theID), filter(adoptedFilter),
    maximumContextLength(0)
{
    // NUL-terminate the ID string, which is a non-aliased copy.
    ID.append((UChar)0);
    ID.truncate(ID.length()-1);
}